

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O3

void compute_padded_integral_img_simd_early_cast_int(uint8_t *gray_image,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  float *pfVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  byte bVar21;
  byte bVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  uint8_t *puVar31;
  float *pfVar32;
  uint uVar33;
  float fVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  ulong uVar41;
  int iVar42;
  float *pfVar43;
  ushort uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 in_XMM8 [16];
  
  pfVar4 = iimage->padded_data;
  uVar33 = iimage->height;
  iVar1 = iimage->data_width;
  lVar38 = (long)iVar1;
  iVar2 = iimage->data_height;
  uVar3 = iimage->width;
  uVar26 = (ulong)(int)uVar3;
  iVar28 = iVar1 - uVar3;
  uVar23 = iVar28 / 2;
  uVar41 = (ulong)uVar23;
  if (1 < iVar28) {
    uVar30 = 0;
    do {
      uVar25 = 0;
      if (7 < iVar1) {
        memset(pfVar4 + uVar30,0,(ulong)(iVar1 - 8U >> 3) * 0x20 + 0x20);
        uVar25 = (iVar1 - 8U & 0xfffffff8) + 8;
      }
      if ((int)uVar25 < iVar1) {
        memset(pfVar4 + (int)((int)uVar30 + uVar25),0,(ulong)(~uVar25 + iVar1) * 4 + 4);
      }
      uVar30 = (ulong)(uint)((int)uVar30 + iVar1);
      uVar41 = uVar41 - 1;
    } while (uVar41 != 0);
  }
  if ((int)uVar23 < iVar2) {
    iVar24 = uVar23 - 7;
    iVar29 = 8;
    if (8 < iVar24) {
      iVar29 = iVar24;
    }
    iVar40 = 0;
    do {
      lVar27 = 0;
      iVar42 = (uVar23 + iVar40) * iVar1;
      if (0xf < iVar28) {
        memset(pfVar4 + iVar42,0,(ulong)(iVar29 - 1U >> 3) * 0x20 + 0x20);
        lVar27 = 0;
        do {
          lVar27 = lVar27 + 8;
        } while (lVar27 < iVar24);
      }
      uVar25 = (uint)lVar27;
      if ((int)uVar25 < (int)uVar23) {
        memset(pfVar4 + (int)(iVar42 + uVar25),0,(ulong)(~uVar25 + uVar23) * 4 + 4);
      }
      iVar40 = iVar40 + 1;
    } while (iVar40 != iVar2 - uVar23);
  }
  auVar54 = _DAT_001a56a0;
  pfVar32 = iimage->data;
  uVar25 = uVar3 + 3;
  if (-1 < (int)uVar3) {
    uVar25 = uVar3;
  }
  if (uVar3 + 3 < 7) {
    uVar41 = 0;
  }
  else {
    auVar48 = ZEXT1664((undefined1  [16])0x0);
    uVar41 = 0;
    do {
      auVar47 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar54,
                                  ZEXT432(*(uint *)(gray_image + uVar41)));
      auVar47 = vpsadbw_avx2(auVar47,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar47 = vpaddd_avx2(auVar47,auVar48._0_32_);
      auVar45 = vpmovqd_avx512vl(auVar47);
      *(undefined1 (*) [16])(pfVar32 + uVar41) = auVar45;
      auVar47 = vpermq_avx2(auVar47,0xff);
      auVar48 = ZEXT3264(auVar47);
      uVar41 = uVar41 + 4;
    } while (uVar41 < (ulong)(long)(int)(uVar25 & 0xfffffffc));
  }
  if (uVar41 < uVar26) {
    fVar34 = pfVar32[uVar41 - 1];
    do {
      fVar34 = (float)((int)fVar34 + (uint)gray_image[uVar41]);
      pfVar32[uVar41] = fVar34;
      uVar41 = uVar41 + 1;
    } while (uVar26 != uVar41);
  }
  auVar54 = _DAT_001a56a0;
  pfVar37 = iimage->data;
  if (1 < uVar33) {
    puVar31 = gray_image + uVar26;
    lVar27 = 1;
    pfVar36 = pfVar32;
    pfVar43 = pfVar37;
    pfVar35 = pfVar32;
    do {
      pfVar35 = pfVar35 + lVar38;
      if (uVar3 + 3 < 7) {
        uVar41 = 0;
      }
      else {
        auVar48 = ZEXT1664((undefined1  [16])0x0);
        uVar41 = 0;
        do {
          auVar47 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar54,
                                      ZEXT432(*(uint *)(puVar31 + uVar41)));
          auVar47 = vpsadbw_avx2(auVar47,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar47 = vpaddd_avx2(auVar47,auVar48._0_32_);
          auVar46 = vpmovqd_avx512vl(auVar47);
          auVar47 = vpermq_avx2(auVar47,0xff);
          auVar48 = ZEXT3264(auVar47);
          auVar45 = vcvtdq2ps_avx(*(undefined1 (*) [16])(pfVar36 + uVar41));
          auVar46 = vpaddd_avx(*(undefined1 (*) [16])(pfVar36 + uVar41),auVar46);
          auVar55._0_4_ = auVar45._0_4_ * 0.003921569;
          auVar55._4_4_ = auVar45._4_4_ * 0.003921569;
          auVar55._8_4_ = auVar45._8_4_ * 0.003921569;
          auVar55._12_4_ = auVar45._12_4_ * 0.003921569;
          *(undefined1 (*) [16])(pfVar43 + uVar41) = auVar55;
          *(undefined1 (*) [16])(pfVar35 + uVar41) = auVar46;
          uVar41 = uVar41 + 4;
        } while (uVar41 < (ulong)(long)(int)(uVar25 & 0xfffffffc));
      }
      lVar39 = (lVar27 + -1) * lVar38;
      if (uVar41 < uVar26) {
        iVar28 = (int)pfVar32[lVar27 * lVar38 + (uVar41 - 1)] - (int)pfVar32[lVar39 + (uVar41 - 1)];
        do {
          auVar45 = vcvtusi2ss_avx512f(in_XMM8,pfVar32[lVar39 + uVar41]);
          iVar28 = iVar28 + (uint)puVar31[uVar41];
          auVar46 = vcvtusi2ss_avx512f(in_XMM8,iVar28);
          fVar34 = (float)vcvttss2usi_avx512f(ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_)));
          pfVar32[lVar27 * lVar38 + uVar41] = fVar34;
          pfVar37[lVar39 + uVar41] = auVar45._0_4_ * 0.003921569;
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar26);
      }
      lVar27 = lVar27 + 1;
      pfVar43 = pfVar43 + lVar38;
      pfVar36 = pfVar36 + lVar38;
      puVar31 = puVar31 + uVar26;
    } while (lVar27 != (int)uVar33);
  }
  if ((int)(uVar26 - 7) == 0) {
    uVar41 = 0;
  }
  else {
    lVar27 = (long)(int)((uVar33 - 1) * iVar1);
    uVar41 = 0;
    do {
      auVar54 = vcvtdq2ps_avx(*(undefined1 (*) [32])(pfVar32 + lVar27 + uVar41));
      pfVar35 = pfVar37 + lVar27 + uVar41;
      *pfVar35 = auVar54._0_4_ * 0.003921569;
      pfVar35[1] = auVar54._4_4_ * 0.003921569;
      pfVar35[2] = auVar54._8_4_ * 0.003921569;
      pfVar35[3] = auVar54._12_4_ * 0.003921569;
      pfVar35[4] = auVar54._16_4_ * 0.003921569;
      pfVar35[5] = auVar54._20_4_ * 0.003921569;
      pfVar35[6] = auVar54._24_4_ * 0.003921569;
      pfVar35[7] = auVar54._28_4_;
      uVar41 = uVar41 + 8;
    } while (uVar41 < uVar26 - 7);
  }
  if (uVar41 <= uVar26 && uVar26 - uVar41 != 0) {
    auVar48 = vbroadcastss_avx512f(ZEXT416(0x3b808081));
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar50 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar51 = vpbroadcastq_avx512f();
    lVar27 = uVar41 + (long)(int)((uVar33 - 1) * iVar1);
    uVar30 = 0;
    do {
      auVar52 = vpbroadcastq_avx512f();
      auVar53 = vporq_avx512f(auVar52,auVar49);
      auVar52 = vporq_avx512f(auVar52,auVar50);
      uVar19 = vpcmpuq_avx512f(auVar52,auVar51,2);
      bVar21 = (byte)uVar19;
      uVar19 = vpcmpuq_avx512f(auVar53,auVar51,2);
      bVar22 = (byte)uVar19;
      uVar44 = CONCAT11(bVar22,bVar21);
      auVar53 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pfVar32 + lVar27 + uVar30));
      auVar52._4_4_ = (uint)((byte)(uVar44 >> 1) & 1) * auVar53._4_4_;
      auVar52._0_4_ = (uint)(bVar21 & 1) * auVar53._0_4_;
      auVar52._8_4_ = (uint)((byte)(uVar44 >> 2) & 1) * auVar53._8_4_;
      auVar52._12_4_ = (uint)((byte)(uVar44 >> 3) & 1) * auVar53._12_4_;
      auVar52._16_4_ = (uint)((byte)(uVar44 >> 4) & 1) * auVar53._16_4_;
      auVar52._20_4_ = (uint)((byte)(uVar44 >> 5) & 1) * auVar53._20_4_;
      auVar52._24_4_ = (uint)((byte)(uVar44 >> 6) & 1) * auVar53._24_4_;
      auVar52._28_4_ = (uint)((byte)(uVar44 >> 7) & 1) * auVar53._28_4_;
      auVar52._32_4_ = (uint)(bVar22 & 1) * auVar53._32_4_;
      auVar52._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar53._36_4_;
      auVar52._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar53._40_4_;
      auVar52._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar53._44_4_;
      auVar52._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar53._48_4_;
      auVar52._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar53._52_4_;
      auVar52._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar53._56_4_;
      auVar52._60_4_ = (uint)(bVar22 >> 7) * auVar53._60_4_;
      auVar52 = vcvtudq2ps_avx512f(auVar52);
      auVar52 = vmulps_avx512f(auVar52,auVar48);
      pfVar35 = pfVar37 + lVar27 + uVar30;
      bVar5 = (bool)((byte)(uVar44 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar44 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar44 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar44 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar44 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar44 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar44 >> 7) & 1);
      bVar12 = (bool)(bVar22 >> 1 & 1);
      bVar13 = (bool)(bVar22 >> 2 & 1);
      bVar14 = (bool)(bVar22 >> 3 & 1);
      bVar15 = (bool)(bVar22 >> 4 & 1);
      bVar16 = (bool)(bVar22 >> 5 & 1);
      bVar17 = (bool)(bVar22 >> 6 & 1);
      *pfVar35 = (float)((uint)(bVar21 & 1) * auVar52._0_4_ |
                        (uint)!(bool)(bVar21 & 1) * (int)*pfVar35);
      pfVar35[1] = (float)((uint)bVar5 * auVar52._4_4_ | (uint)!bVar5 * (int)pfVar35[1]);
      pfVar35[2] = (float)((uint)bVar6 * auVar52._8_4_ | (uint)!bVar6 * (int)pfVar35[2]);
      pfVar35[3] = (float)((uint)bVar7 * auVar52._12_4_ | (uint)!bVar7 * (int)pfVar35[3]);
      pfVar35[4] = (float)((uint)bVar8 * auVar52._16_4_ | (uint)!bVar8 * (int)pfVar35[4]);
      pfVar35[5] = (float)((uint)bVar9 * auVar52._20_4_ | (uint)!bVar9 * (int)pfVar35[5]);
      pfVar35[6] = (float)((uint)bVar10 * auVar52._24_4_ | (uint)!bVar10 * (int)pfVar35[6]);
      pfVar35[7] = (float)((uint)bVar11 * auVar52._28_4_ | (uint)!bVar11 * (int)pfVar35[7]);
      pfVar35[8] = (float)((uint)(bVar22 & 1) * auVar52._32_4_ |
                          (uint)!(bool)(bVar22 & 1) * (int)pfVar35[8]);
      pfVar35[9] = (float)((uint)bVar12 * auVar52._36_4_ | (uint)!bVar12 * (int)pfVar35[9]);
      pfVar35[10] = (float)((uint)bVar13 * auVar52._40_4_ | (uint)!bVar13 * (int)pfVar35[10]);
      pfVar35[0xb] = (float)((uint)bVar14 * auVar52._44_4_ | (uint)!bVar14 * (int)pfVar35[0xb]);
      pfVar35[0xc] = (float)((uint)bVar15 * auVar52._48_4_ | (uint)!bVar15 * (int)pfVar35[0xc]);
      pfVar35[0xd] = (float)((uint)bVar16 * auVar52._52_4_ | (uint)!bVar16 * (int)pfVar35[0xd]);
      pfVar35[0xe] = (float)((uint)bVar17 * auVar52._56_4_ | (uint)!bVar17 * (int)pfVar35[0xe]);
      pfVar35[0xf] = (float)((uint)(bVar22 >> 7) * auVar52._60_4_ |
                            (uint)!(bool)(bVar22 >> 7) * (int)pfVar35[0xf]);
      uVar30 = uVar30 + 0x10;
    } while (((uVar26 - uVar41) + 0xf & 0xfffffffffffffff0) != uVar30);
  }
  iVar28 = uVar23 + uVar33;
  if (0 < (int)uVar33) {
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    iVar29 = uVar3 + uVar23;
    lVar27 = (long)(int)uVar23;
    pfVar32 = pfVar4 + lVar38 * lVar27;
    do {
      fVar34 = pfVar4[(long)((int)lVar27 * iVar1 + iVar29) + -1];
      auVar45._4_4_ = fVar34;
      auVar45._0_4_ = fVar34;
      auVar45._8_4_ = fVar34;
      auVar45._12_4_ = fVar34;
      auVar54._16_4_ = fVar34;
      auVar54._0_16_ = auVar45;
      auVar54._20_4_ = fVar34;
      auVar54._24_4_ = fVar34;
      auVar54._28_4_ = fVar34;
      lVar39 = (long)iVar29;
      iVar24 = iVar29;
      if (iVar29 < (int)(lVar38 + -7)) {
        do {
          *(undefined1 (*) [32])(pfVar32 + lVar39) = auVar54;
          lVar39 = lVar39 + 8;
        } while (lVar39 < lVar38 + -7);
        iVar24 = (int)lVar39;
      }
      if (iVar24 < iVar1) {
        auVar50 = vbroadcastss_avx512f(auVar45);
        auVar51 = vpbroadcastq_avx512f();
        uVar26 = 0;
        do {
          auVar52 = vpbroadcastq_avx512f();
          auVar53 = vporq_avx512f(auVar52,auVar48);
          auVar52 = vporq_avx512f(auVar52,auVar49);
          uVar19 = vpcmpuq_avx512f(auVar52,auVar51,2);
          uVar20 = vpcmpuq_avx512f(auVar53,auVar51,2);
          bVar21 = (byte)uVar20;
          uVar44 = CONCAT11(bVar21,(byte)uVar19);
          pfVar37 = pfVar32 + (long)iVar24 + uVar26;
          bVar5 = (bool)((byte)uVar19 & 1);
          bVar6 = (bool)((byte)(uVar44 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar44 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar44 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar44 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar44 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar44 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar44 >> 7) & 1);
          bVar13 = (bool)(bVar21 >> 1 & 1);
          bVar14 = (bool)(bVar21 >> 2 & 1);
          bVar15 = (bool)(bVar21 >> 3 & 1);
          bVar16 = (bool)(bVar21 >> 4 & 1);
          bVar17 = (bool)(bVar21 >> 5 & 1);
          bVar18 = (bool)(bVar21 >> 6 & 1);
          *pfVar37 = (float)((uint)bVar5 * auVar50._0_4_ | (uint)!bVar5 * (int)*pfVar37);
          pfVar37[1] = (float)((uint)bVar6 * auVar50._4_4_ | (uint)!bVar6 * (int)pfVar37[1]);
          pfVar37[2] = (float)((uint)bVar7 * auVar50._8_4_ | (uint)!bVar7 * (int)pfVar37[2]);
          pfVar37[3] = (float)((uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * (int)pfVar37[3]);
          pfVar37[4] = (float)((uint)bVar9 * auVar50._16_4_ | (uint)!bVar9 * (int)pfVar37[4]);
          pfVar37[5] = (float)((uint)bVar10 * auVar50._20_4_ | (uint)!bVar10 * (int)pfVar37[5]);
          pfVar37[6] = (float)((uint)bVar11 * auVar50._24_4_ | (uint)!bVar11 * (int)pfVar37[6]);
          pfVar37[7] = (float)((uint)bVar12 * auVar50._28_4_ | (uint)!bVar12 * (int)pfVar37[7]);
          pfVar37[8] = (float)((uint)(bVar21 & 1) * auVar50._32_4_ |
                              (uint)!(bool)(bVar21 & 1) * (int)pfVar37[8]);
          pfVar37[9] = (float)((uint)bVar13 * auVar50._36_4_ | (uint)!bVar13 * (int)pfVar37[9]);
          pfVar37[10] = (float)((uint)bVar14 * auVar50._40_4_ | (uint)!bVar14 * (int)pfVar37[10]);
          pfVar37[0xb] = (float)((uint)bVar15 * auVar50._44_4_ | (uint)!bVar15 * (int)pfVar37[0xb]);
          pfVar37[0xc] = (float)((uint)bVar16 * auVar50._48_4_ | (uint)!bVar16 * (int)pfVar37[0xc]);
          pfVar37[0xd] = (float)((uint)bVar17 * auVar50._52_4_ | (uint)!bVar17 * (int)pfVar37[0xd]);
          pfVar37[0xe] = (float)((uint)bVar18 * auVar50._56_4_ | (uint)!bVar18 * (int)pfVar37[0xe]);
          pfVar37[0xf] = (float)((uint)(bVar21 >> 7) * auVar50._60_4_ |
                                (uint)!(bool)(bVar21 >> 7) * (int)pfVar37[0xf]);
          uVar26 = uVar26 + 0x10;
        } while (((lVar38 - iVar24) + 0xfU & 0xfffffffffffffff0) != uVar26);
      }
      lVar27 = lVar27 + 1;
      pfVar32 = pfVar32 + lVar38;
    } while (lVar27 < iVar28);
  }
  if (iVar28 < iVar2) {
    lVar27 = (long)iVar28;
    iVar24 = (uVar23 - 7) + uVar3;
    iVar29 = uVar23 + uVar3;
    pfVar32 = pfVar4 + lVar38 * lVar27;
    pfVar37 = pfVar4 + (lVar27 + -1) * lVar38;
    do {
      lVar39 = (long)(int)uVar23;
      uVar33 = uVar23;
      if ((int)uVar23 < iVar24) {
        do {
          *(undefined1 (*) [32])(pfVar32 + lVar39) = *(undefined1 (*) [32])(pfVar37 + lVar39);
          lVar39 = lVar39 + 8;
        } while (lVar39 < iVar24);
        uVar33 = (uint)lVar39;
      }
      if ((int)uVar33 < iVar29) {
        lVar39 = (long)(int)uVar33;
        do {
          pfVar32[lVar39] = pfVar37[lVar39];
          lVar39 = lVar39 + 1;
        } while (iVar29 != lVar39);
      }
      lVar27 = lVar27 + 1;
      pfVar37 = pfVar37 + lVar38;
      pfVar32 = pfVar32 + lVar38;
    } while (lVar27 < iVar2);
    if (iVar28 < iVar2) {
      auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      lVar27 = (long)iVar28;
      pfVar32 = pfVar4 + lVar38 * lVar27;
      fVar34 = pfVar4[(long)((iVar28 + -1) * iVar1 + iVar29) + -1];
      auVar46._4_4_ = fVar34;
      auVar46._0_4_ = fVar34;
      auVar46._8_4_ = fVar34;
      auVar46._12_4_ = fVar34;
      auVar47._16_4_ = fVar34;
      auVar47._0_16_ = auVar46;
      auVar47._20_4_ = fVar34;
      auVar47._24_4_ = fVar34;
      auVar47._28_4_ = fVar34;
      auVar50 = vbroadcastss_avx512f(auVar46);
      do {
        lVar39 = (long)iVar29;
        iVar28 = iVar29;
        if (iVar29 < (int)(lVar38 + -7)) {
          do {
            *(undefined1 (*) [32])(pfVar32 + lVar39) = auVar47;
            lVar39 = lVar39 + 8;
          } while (lVar39 < lVar38 + -7);
          iVar28 = (int)lVar39;
        }
        if (iVar28 < iVar1) {
          auVar51 = vpbroadcastq_avx512f();
          uVar26 = 0;
          do {
            auVar52 = vpbroadcastq_avx512f();
            auVar53 = vporq_avx512f(auVar52,auVar48);
            auVar52 = vporq_avx512f(auVar52,auVar49);
            uVar19 = vpcmpuq_avx512f(auVar52,auVar51,2);
            uVar20 = vpcmpuq_avx512f(auVar53,auVar51,2);
            bVar21 = (byte)uVar20;
            uVar44 = CONCAT11(bVar21,(byte)uVar19);
            pfVar4 = pfVar32 + (long)iVar28 + uVar26;
            bVar5 = (bool)((byte)uVar19 & 1);
            bVar6 = (bool)((byte)(uVar44 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar44 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar44 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar44 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar44 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar44 >> 6) & 1);
            bVar12 = (bool)((byte)(uVar44 >> 7) & 1);
            bVar13 = (bool)(bVar21 >> 1 & 1);
            bVar14 = (bool)(bVar21 >> 2 & 1);
            bVar15 = (bool)(bVar21 >> 3 & 1);
            bVar16 = (bool)(bVar21 >> 4 & 1);
            bVar17 = (bool)(bVar21 >> 5 & 1);
            bVar18 = (bool)(bVar21 >> 6 & 1);
            *pfVar4 = (float)((uint)bVar5 * auVar50._0_4_ | (uint)!bVar5 * (int)*pfVar4);
            pfVar4[1] = (float)((uint)bVar6 * auVar50._4_4_ | (uint)!bVar6 * (int)pfVar4[1]);
            pfVar4[2] = (float)((uint)bVar7 * auVar50._8_4_ | (uint)!bVar7 * (int)pfVar4[2]);
            pfVar4[3] = (float)((uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * (int)pfVar4[3]);
            pfVar4[4] = (float)((uint)bVar9 * auVar50._16_4_ | (uint)!bVar9 * (int)pfVar4[4]);
            pfVar4[5] = (float)((uint)bVar10 * auVar50._20_4_ | (uint)!bVar10 * (int)pfVar4[5]);
            pfVar4[6] = (float)((uint)bVar11 * auVar50._24_4_ | (uint)!bVar11 * (int)pfVar4[6]);
            pfVar4[7] = (float)((uint)bVar12 * auVar50._28_4_ | (uint)!bVar12 * (int)pfVar4[7]);
            pfVar4[8] = (float)((uint)(bVar21 & 1) * auVar50._32_4_ |
                               (uint)!(bool)(bVar21 & 1) * (int)pfVar4[8]);
            pfVar4[9] = (float)((uint)bVar13 * auVar50._36_4_ | (uint)!bVar13 * (int)pfVar4[9]);
            pfVar4[10] = (float)((uint)bVar14 * auVar50._40_4_ | (uint)!bVar14 * (int)pfVar4[10]);
            pfVar4[0xb] = (float)((uint)bVar15 * auVar50._44_4_ | (uint)!bVar15 * (int)pfVar4[0xb]);
            pfVar4[0xc] = (float)((uint)bVar16 * auVar50._48_4_ | (uint)!bVar16 * (int)pfVar4[0xc]);
            pfVar4[0xd] = (float)((uint)bVar17 * auVar50._52_4_ | (uint)!bVar17 * (int)pfVar4[0xd]);
            pfVar4[0xe] = (float)((uint)bVar18 * auVar50._56_4_ | (uint)!bVar18 * (int)pfVar4[0xe]);
            pfVar4[0xf] = (float)((uint)(bVar21 >> 7) * auVar50._60_4_ |
                                 (uint)!(bool)(bVar21 >> 7) * (int)pfVar4[0xf]);
            uVar26 = uVar26 + 0x10;
          } while (((lVar38 - iVar28) + 0xfU & 0xfffffffffffffff0) != uVar26);
        }
        lVar27 = lVar27 + 1;
        pfVar32 = pfVar32 + lVar38;
      } while (lVar27 < iVar2);
    }
  }
  return;
}

Assistant:

void compute_padded_integral_img_simd_early_cast_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    float *iimage_padded_data = iimage->padded_data;

    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    __m256 zeros_float = _mm256_setzero_ps();

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        int i = 0;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        int i = 0;
        for (; i < border - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
        __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
        //__m256i ZERO = _mm256_set1_epi32(0);
        __m256i ZERO = _mm256_setzero_si256();
        
        // Implementation adapted from:
        // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
        // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

        uint32_t *iimage_idata = (uint32_t *) iimage->data;

        size_t aligned_width = width / 4 * 4;

        {
            __m256i row_sums = ZERO;
            size_t i = 0;
            for(; i < aligned_width; i+=4) {

                // If (gray_image + i) has following uint8_t pixels: a b c d
                // a0000000 ab000000 abc00000 abcd0000
                __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
                
                // Summing together blocks of 8 uint8_t's and storing results
                // uint32_t eeee = a
                // uint32_t ffff = a + b
                // uint32_t gggg = a + b + c
                // uint32_t hhhh = a + b + c + d
                // eeee0000 ffff0000 gggg0000 hhhh0000
                __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

                // Updating row_sum by adding previously computed img_sad_sum
                //   eeee0000 ffff0000 hhhh0000 hhhh0000
                // + iiii**** jjjj**** kkkk**** llll****
                // -------------------------------------
                //   mmmm**** nnnn**** oooo**** pppp****
                row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

                // Permuting row_sum from first row to second and cutting off upper 128 bits
                // mmmm**** nnnn**** oooo**** pppp****
                // mmmmnnnn oooopppp ******** ********
                __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
                
                // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
                // 
                _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
                //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
                
                // Updating row_sums to only include highest of four values (pppp)
                // mmmm**** nnnn**** oooo**** pppp****
                // pppp**** pppp**** pppp**** pppp****
                row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

            }
            uint32_t row_sum = iimage_idata[i - 1];
            for (; i < width; ++i) {
                row_sum += gray_image[i];
                iimage_idata[i] = row_sum;
            }
        }

        float *iimage_data = iimage->data;
        __m128 factor = _mm_set1_ps(1.0f / 255.0f);

        for(size_t j = 1; j < height; ++j) {

            __m256i row_sums = ZERO;

            size_t i = 0;
            for(; i < aligned_width; i+=4) {

                // If (gray_image + i) has following uint8_t pixels: a b c d
                // a0000000 ab000000 abc00000 abcd0000
                __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
                
                // Summing together blocks of 8 uint8_t's and storing results
                // uint32_t eeee = a
                // uint32_t ffff = a + b
                // uint32_t gggg = a + b + c
                // uint32_t hhhh = a + b + c + d
                // eeee0000 ffff0000 gggg0000 hhhh0000
                __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

                // Updating row_sum by adding previously computed img_sad_sum
                //   eeee0000 ffff0000 hhhh0000 hhhh0000
                // + iiii**** jjjj**** kkkk**** llll****
                // -------------------------------------
                //   mmmm**** nnnn**** oooo**** pppp****
                row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

                // Permuting row_sum from first row to second and cutting off upper 128 bits
                // mmmm**** nnnn**** oooo**** pppp****
                // mmmmnnnn oooopppp ******** ********
                __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

                // Loading row_sum from previous row
                __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
                //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

                // AVX512 only :(
                //__m128 prev_row_sums_cast = _mm_cvtepu32_ps(prev_row_sums);
                __m128 prev_row_sums_cast = _mm_cvtepi32_ps(prev_row_sums);
                //__128 prev_row_sums_cast = _my_mm_cvtepu32_ps(prev_row_sums);

                // Multiplying float version of previous row sum converted with (1.0f/255.0f) 
                __m128 prev_iimage_float = _mm_mul_ps(factor, prev_row_sums_cast);

                // Storing float of previous row sum back to memory as final integral image value
                _mm_storeu_ps(iimage_data +(j-1) * data_width + i, prev_iimage_float);

                // Adding curr_row_sums with prev_row_sums
                __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

                // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
                _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
                //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
                
                // Updating row_sums to only include highest of four values (pppp)
                // mmmm**** nnnn**** oooo**** pppp****
                // pppp**** pppp**** pppp**** pppp****
                row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

            }

            uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
            for (; i < width; ++i) {
                row_sum += gray_image[j * width + i];
                float prev_row_sum = iimage_idata[(j-1) * data_width + i];
                iimage_idata[j * data_width + i] = row_sum + prev_row_sum;
                iimage_data[(j-1) * data_width + i] = (1.0f / 255.0f) * ((float) prev_row_sum);
            }

        }

        // Converting last row to floats
        __m256 factor256 = _mm256_set1_ps(1.0f / 255.0f);
        size_t i = 0;
        for (; i < width - 7; i+=8) { // TODO: Check if -7 correct here

            __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + (height - 1) * data_width + i));
            //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

            // AVX512 only :(
            //__m256 v_float = _mm256_cvtepu32_ps(v_int);
            __m256 v_float = _mm256_cvtepi32_ps(v_int);
            //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

            // Multiplying converted float with (1.0f/255.0f) 
            __m256 v_iimage = _mm256_mul_ps(factor256, v_float);

            // Storing value back to memory
            _mm256_storeu_ps(iimage_data + (height - 1) * data_width + i, v_iimage);

        } 

        for (; i < width; ++i) {
            iimage_data[(height - 1) * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[(height - 1) * data_width + i]);
        }

    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row_float = iimage_padded_data[j * data_width + border + width - 1];
        __m256 last_element_in_row_vec = _mm256_set1_ps(last_element_in_row_float);
        int i = width + border;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, last_element_in_row_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row_float;
        }
    }

    // BLOCK D   
    for (int j = border + height; j < data_height; ++j) {
        int i = border;
        for (; i < width + border - 7; i+=8) {
            __m256 prev_elements_in_row = _mm256_loadu_ps(iimage_padded_data + (j-1) * data_width + i);
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row);
        }
        for (; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }
 
// TODO: WRITE SECOND VERSION WITH COLMAJOR
/*  
    int i = border;
    for (; i < width + border - 7; i+=8) {
        __m256 prev_elements_in_row_vec = _mm256_loadu_ps(iimage_padded_data + (border + height - 1) * data_width + i);
        for (int j = border + height; j < data_height; ++j) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row_vec);
        }
    }
    for (; i < width + border; ++i) {
        float prev_elements_in_row_float = iimage_padded_data[(border + height - 1) * data_width + i];
        for (int j = border + height; j < data_height; ++j) {
            iimage_padded_data[j * data_width + i] = prev_elements_in_row_float;
        }
    }
*/    

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value_float = iimage_padded_data[index_last_element];
    __m256 max_value_vec = _mm256_set1_ps(max_value_float);
    for (int j = border + height; j < data_height; ++j) {
        int i = border + width;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, max_value_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value_float;
        }
    }
    
}